

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QIcon __thiscall QWidget::windowIcon(QWidget *this)

{
  bool bVar1;
  type pQVar2;
  QWidget *in_RSI;
  QIconPrivate *in_RDI;
  QWidgetPrivate *d;
  QWidget *w;
  QIconPrivate *this_00;
  QWidget *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RSI;
  do {
    if (local_18 == (QWidget *)0x0) {
      QGuiApplication::windowIcon();
      return (QIcon)in_RDI;
    }
    d_func((QWidget *)0x37202f);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x372042);
    if (bVar1) {
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x372056);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x372062);
      if (bVar1) {
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x372076);
        std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                  ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x372082);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QIcon,_std::default_delete<QIcon>_> *)0x37208a);
        if (bVar1) {
          std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37209e);
          std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                    ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x3720aa);
          pQVar2 = std::unique_ptr<QIcon,_std::default_delete<QIcon>_>::operator*
                             ((unique_ptr<QIcon,_std::default_delete<QIcon>_> *)this_00);
          QIcon::QIcon((QIcon *)this_00,(QIcon *)pQVar2);
          return (QIcon)in_RDI;
        }
      }
    }
    local_18 = parentWidget((QWidget *)0x3720cb);
  } while( true );
}

Assistant:

QIcon QWidget::windowIcon() const
{
    const QWidget *w = this;
    while (w) {
        const QWidgetPrivate *d = w->d_func();
        if (d->extra && d->extra->topextra && d->extra->topextra->icon)
            return *d->extra->topextra->icon;
        w = w->parentWidget();
    }
    return QApplication::windowIcon();
}